

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACInfoWnd.cpp
# Opt level: O0

void __thiscall ACIWnd::SetAcKey(ACIWnd *this,FDKeyTy *_key)

{
  FDKeyTy *in_RDI;
  ACIWnd *unaff_retaddr;
  ACIWnd *in_stack_00000008;
  FDKeyTy *in_stack_ffffffffffffff88;
  LTImgWindow *this_00;
  string *title;
  ImgWindow *in_stack_ffffffffffffffa0;
  string local_50 [28];
  undefined4 in_stack_ffffffffffffffcc;
  _func_int **in_stack_ffffffffffffffd0;
  
  ClearAcKey(unaff_retaddr);
  LTFlightData::FDKeyTy::operator=(in_RDI,in_stack_ffffffffffffff88);
  this_00 = (LTImgWindow *)&stack0xffffffffffffffd0;
  LTFlightData::FDKeyTy::operator_cast_to_string((FDKeyTy *)this_00);
  std::__cxx11::string::operator=((string *)&in_RDI[0x12].key._M_string_length,(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  title = (string *)local_50;
  GetWndTitle_abi_cxx11_(in_stack_00000008);
  ImgWindow::SetWindowTitle(in_stack_ffffffffffffffa0,title);
  std::__cxx11::string::~string(local_50);
  LTImgWindow::ReturnKeyboardFocus(this_00);
  DataRefs::LTSetAcKey(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

void ACIWnd::SetAcKey (const LTFlightData::FDKeyTy& _key)
{
    ClearAcKey();                   // clear a lot of data
    keyEntry = (acKey = _key);      // remember the key
    SetWindowTitle(GetWndTitle());  // set the window's title
    ReturnKeyboardFocus();          // give up keyboard focus in case we had it

    // set as 'selected' aircraft for debug output
    dataRefs.LTSetAcKey(reinterpret_cast<void*>(long(DR_AC_KEY)),
                        (int)acKey.num);
}